

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.hpp
# Opt level: O1

matrix4x4_t<float> *
yama::matrix4x4_t<float>::scaling
          (matrix4x4_t<float> *__return_storage_ptr__,value_type_conflict1 *x,
          value_type_conflict1 *y,value_type_conflict1 *z)

{
  float fVar1;
  float fVar2;
  
  if (ABS(*x) <= 1e-05) {
    __assert_fail("(!close(x, value_type(0))) && \"scale shouldn\'t be zero\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/yama-src/include/yama/matrix4x4.hpp"
                  ,0x8b,
                  "static matrix4x4_t<T> yama::matrix4x4_t<float>::scaling(const value_type &, const value_type &, const value_type &) [T = float]"
                 );
  }
  fVar1 = *y;
  if (1e-05 < ABS(fVar1)) {
    fVar2 = *z;
    if (1e-05 < ABS(fVar2)) {
      __return_storage_ptr__->m00 = *x;
      __return_storage_ptr__->m10 = 0.0;
      __return_storage_ptr__->m20 = 0.0;
      __return_storage_ptr__->m30 = 0.0;
      __return_storage_ptr__->m01 = 0.0;
      __return_storage_ptr__->m11 = fVar1;
      __return_storage_ptr__->m21 = 0.0;
      __return_storage_ptr__->m31 = 0.0;
      __return_storage_ptr__->m02 = 0.0;
      __return_storage_ptr__->m12 = 0.0;
      __return_storage_ptr__->m22 = fVar2;
      __return_storage_ptr__->m32 = 0.0;
      __return_storage_ptr__->m03 = 0.0;
      __return_storage_ptr__->m13 = 0.0;
      __return_storage_ptr__->m23 = 0.0;
      __return_storage_ptr__->m33 = 1.0;
      return __return_storage_ptr__;
    }
    __assert_fail("(!close(z, value_type(0))) && \"scale shouldn\'t be zero\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/yama-src/include/yama/matrix4x4.hpp"
                  ,0x8d,
                  "static matrix4x4_t<T> yama::matrix4x4_t<float>::scaling(const value_type &, const value_type &, const value_type &) [T = float]"
                 );
  }
  __assert_fail("(!close(y, value_type(0))) && \"scale shouldn\'t be zero\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/yama-src/include/yama/matrix4x4.hpp"
                ,0x8c,
                "static matrix4x4_t<T> yama::matrix4x4_t<float>::scaling(const value_type &, const value_type &, const value_type &) [T = float]"
               );
}

Assistant:

static constexpr matrix4x4_t scaling(const value_type& x, const value_type& y, const value_type& z)
    {
        YAMA_ASSERT_WARN(!close(x, value_type(0)), "scale shouldn't be zero");
        YAMA_ASSERT_WARN(!close(y, value_type(0)), "scale shouldn't be zero");
        YAMA_ASSERT_WARN(!close(z, value_type(0)), "scale shouldn't be zero");
        return columns(
            x, 0, 0, 0,
            0, y, 0, 0,
            0, 0, z, 0,
            0, 0, 0, 1
        );
    }